

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

void calculate_breakpoint_mask(void)

{
  long lVar1;
  Breakpoint *bp;
  int id;
  
  s_breakpoint_mask[0] = 0xffff;
  s_breakpoint_mask[1] = 0xffff;
  for (bp._4_4_ = 0; bp._4_4_ < s_breakpoint_max_id; bp._4_4_ = bp._4_4_ + 1) {
    lVar1 = (long)bp._4_4_;
    if (((s_breakpoints[lVar1].field_0x7 & 1) != 0) &&
       (((byte)s_breakpoints[lVar1].field_0x7 >> 1 & 1) != 0)) {
      s_breakpoint_mask[0] = s_breakpoint_mask[0] & (s_breakpoints[lVar1].addr ^ 0xffff);
      s_breakpoint_mask[1] = s_breakpoint_mask[1] & s_breakpoints[lVar1].addr;
    }
  }
  return;
}

Assistant:

static void calculate_breakpoint_mask(void) {
  s_breakpoint_mask[0] = 0xffffu;
  s_breakpoint_mask[1] = 0xffffu;
  int id;
  for (id = 0; id < s_breakpoint_max_id; ++id) {
    Breakpoint* bp = &s_breakpoints[id];
    if (!(bp->valid && bp->enabled)) {
      continue;
    }
    s_breakpoint_mask[0] &= ~bp->addr;
    s_breakpoint_mask[1] &= bp->addr;
  }
}